

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::Operation::MergeFrom(Operation *this,Operation *from)

{
  LogMessage *other;
  ulong uVar1;
  Operation *pOVar2;
  Arena *pAVar3;
  LogFinisher local_75;
  uint32_t cached_has_bits;
  byte local_61;
  LogMessage local_60;
  Operation *local_28;
  Operation *from_local;
  Operation *this_local;
  Operation *local_10;
  
  local_61 = 0;
  local_28 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/MIL.pb.cc"
               ,0xa1a);
    local_61 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_75,other);
  }
  if ((local_61 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::MergeFrom(&this->inputs_,&local_28->inputs_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::MergeFrom
            (&this->outputs_,&local_28->outputs_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Block>::MergeFrom
            (&this->blocks_,&local_28->blocks_);
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::MergeFrom(&this->attributes_,&local_28->attributes_);
  _internal_type_abi_cxx11_(local_28);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pOVar2 = (Operation *)_internal_type_abi_cxx11_(local_28);
    this_local = pOVar2;
    local_10 = this;
    pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->type_,pOVar2,pAVar3);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_28->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Operation::MergeFrom(const Operation& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.Operation)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  inputs_.MergeFrom(from.inputs_);
  outputs_.MergeFrom(from.outputs_);
  blocks_.MergeFrom(from.blocks_);
  attributes_.MergeFrom(from.attributes_);
  if (!from._internal_type().empty()) {
    _internal_set_type(from._internal_type());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}